

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase
          (IncompleteCubeWrapModeCase *this,TestContext *testCtx,RenderContext *renderCtx,char *name
          ,char *description,IVec2 *size,deUint32 wrapT,deUint32 wrapS,ContextInfo *ctxInfo)

{
  IVec2 *size_local;
  char *description_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  IncompleteCubeWrapModeCase *this_local;
  
  TexCubeCompletenessCase::TexCubeCompletenessCase
            (&this->super_TexCubeCompletenessCase,testCtx,renderCtx,name,description);
  (this->super_TexCubeCompletenessCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompleteCubeWrapModeCase_03289910;
  *(deUint32 *)&(this->super_TexCubeCompletenessCase).field_0x84 = wrapT;
  this->m_wrapS = wrapS;
  this->m_ctxInfo = ctxInfo;
  tcu::Vector<int,_2>::Vector(&this->m_size,size);
  return;
}

Assistant:

IncompleteCubeWrapModeCase::IncompleteCubeWrapModeCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* description, IVec2 size, deUint32 wrapT, deUint32 wrapS, const glu::ContextInfo& ctxInfo)
	: TexCubeCompletenessCase	(testCtx, renderCtx, name, description)
	, m_wrapT					(wrapT)
	, m_wrapS					(wrapS)
	, m_ctxInfo					(ctxInfo)
	, m_size					(size)
{
}